

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmGhsMultiTargetGenerator::WriteSources(cmGhsMultiTargetGenerator *this,ostream *fout_proj)

{
  _Rb_tree_header *p_Var1;
  Types TVar2;
  cmMakefile *pcVar3;
  pointer pcVar4;
  iterator __position;
  pointer ppcVar5;
  cmGeneratorTarget *pcVar6;
  cmSourceFile *this_00;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile;
  undefined8 uVar7;
  char *pcVar8;
  undefined8 uVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  string *psVar14;
  cmSourceGroup *this_01;
  vector<cmSourceFile*,std::allocator<cmSourceFile*>> *this_02;
  iterator iVar15;
  _Base_ptr p_Var16;
  mapped_type *pmVar17;
  cmValue cVar18;
  ostream *poVar19;
  cmGeneratedFileStream *pcVar20;
  cmCustomCommand *pcVar21;
  long *plVar22;
  cmSourceFileLocation *pcVar23;
  cmAlphaNum *pcVar24;
  char *extraout_RDX;
  cmSourceFile *sourceFile;
  pointer ppcVar25;
  pointer pbVar26;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  __i;
  ulong uVar27;
  pointer ppcVar28;
  cmGhsMultiTargetGenerator *pcVar29;
  long lVar30;
  cmGeneratedFileStream *fout;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string_view value;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar31;
  string objectName;
  string gname;
  string fext;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groupFilesList;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  string fname_1;
  string lpath;
  string fpath;
  string gn;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  standardGroups;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groupNames;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> sourceGroups;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
  groupFiles;
  cmSourceFile *sf;
  _Base_ptr p_Var32;
  _Alloc_hider in_stack_fffffffffffff920;
  _Alloc_hider _Var33;
  size_type local_6d8;
  undefined1 local_6d0 [40];
  undefined1 local_6a8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_690 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_670;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_660;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_650;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_638;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_618;
  cmGeneratedFileStream **local_608;
  _Base_ptr local_5f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5e0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_5d0;
  bool local_5b0;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_5a8;
  string local_590;
  string local_570;
  cmAlphaNum local_550;
  _Base_ptr local_518;
  cmGeneratedFileStream *local_510;
  string local_508;
  string local_4e8;
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_490;
  undefined1 local_488 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_470;
  size_t local_468;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_460;
  _Base_ptr local_450;
  cmAlphaNum *local_448;
  _Base_ptr local_440;
  size_t local_438;
  _Alloc_hider local_430;
  size_type local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420;
  cmAlphaNum *local_410;
  _Alloc_hider local_408;
  undefined1 local_400 [32];
  size_type local_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  undefined8 local_3c8;
  undefined8 local_248;
  undefined8 uStack_240;
  code *local_238;
  undefined8 uStack_230;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_220;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> local_1d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
  local_1c0;
  undefined1 local_190 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178 [20];
  
  local_5a8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_5a8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5a8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetSourceFiles(this->GeneratorTarget,&local_5a8,&this->ConfigName);
  local_510 = (cmGeneratedFileStream *)fout_proj;
  std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector
            (&local_1d8,&this->Makefile->SourceGroups);
  ppcVar5 = local_5a8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_1c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1c0._M_impl.super__Rb_tree_header._M_header;
  local_1c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &local_208._M_impl.super__Rb_tree_header;
  local_208._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_208._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_208._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_208._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_208._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_1c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1c0._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_5a8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_5a8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppcVar25 = local_5a8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    do {
      local_190._0_8_ = *ppcVar25;
      pcVar3 = this->Makefile;
      psVar14 = cmSourceFile::ResolveFullPath
                          ((cmSourceFile *)local_190._0_8_,(string *)0x0,(string *)0x0);
      this_01 = cmMakefile::FindSourceGroup(pcVar3,psVar14,&local_1d8);
      psVar14 = cmSourceGroup::GetFullName_abi_cxx11_(this_01);
      pcVar4 = (psVar14->_M_dataplus)._M_p;
      local_4b0._0_8_ = local_4a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_4b0,pcVar4,pcVar4 + psVar14->_M_string_length);
      this_02 = (vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                              *)&local_1c0,(key_type *)local_4b0);
      __position._M_current = *(cmSourceFile ***)(this_02 + 8);
      if (__position._M_current == *(cmSourceFile ***)(this_02 + 0x10)) {
        std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
        _M_realloc_insert<cmSourceFile*const&>(this_02,__position,(cmSourceFile **)local_190);
      }
      else {
        *__position._M_current = (cmSourceFile *)local_190._0_8_;
        *(long *)(this_02 + 8) = *(long *)(this_02 + 8) + 8;
      }
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_208,(key_type *)local_4b0);
      if ((undefined1 *)local_4b0._0_8_ != local_4a0) {
        operator_delete((void *)local_4b0._0_8_,local_4a0._0_8_ + 1);
      }
      ppcVar25 = ppcVar25 + 1;
    } while (ppcVar25 != ppcVar5);
  }
  local_4b0._0_8_ = local_4a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"CMake Rules","");
  local_490 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_488 + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"Header Files","");
  local_470 = &local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"Source Files","");
  local_450 = (_Base_ptr)&local_440;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"Object Files","");
  local_430._M_p = (pointer)&local_420;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"Object Libraries","");
  pcVar24 = (cmAlphaNum *)local_400;
  local_410 = pcVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"Resources","");
  __l._M_len = 6;
  __l._M_array = (iterator)local_4b0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_220,__l,(allocator_type *)local_190);
  lVar30 = -0xc0;
  do {
    if (pcVar24 != *(cmAlphaNum **)(pcVar24[-1].Digits_ + 0x10)) {
      operator_delete(*(cmAlphaNum **)(pcVar24[-1].Digits_ + 0x10),
                      (ulong)((long)&(pcVar24->RValueString_->_M_dataplus)._M_p + 1));
    }
    pcVar24 = (cmAlphaNum *)pcVar24[-1].Digits_;
    lVar30 = lVar30 + 0x20;
  } while (lVar30 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_650,local_1c0._M_impl.super__Rb_tree_header._M_node_count,
           (allocator_type *)local_4b0);
  uVar27 = 0;
  if (local_220.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_220.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar26 = local_220.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar15 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&local_208,pbVar26);
      iVar13 = (int)uVar27;
      if ((_Rb_tree_header *)iVar15._M_node == p_Var1) {
        if ((this->TagType == CUSTOM_TARGET) &&
           (iVar12 = std::__cxx11::string::compare((char *)pbVar26), iVar12 == 0)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::resize(&local_650,
                   ((long)local_650.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_650.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
          std::__cxx11::string::_M_assign
                    ((string *)
                     (local_650.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + iVar13));
          goto LAB_003b842f;
        }
      }
      else {
        std::__cxx11::string::_M_assign
                  ((string *)
                   (local_650.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + iVar13));
        pVar31 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::equal_range(&local_208,pbVar26);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_aux(&local_208,(_Base_ptr)pVar31.first._M_node,(_Base_ptr)pVar31.second._M_node);
LAB_003b842f:
        uVar27 = (ulong)(iVar13 + 1);
      }
      pbVar26 = pbVar26 + 1;
    } while (pbVar26 !=
             local_220.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    uVar27 = (ulong)(int)uVar27;
  }
  local_4b0._0_8_ = local_4a0;
  local_4b0._8_8_ = (cmGeneratorTarget *)0x0;
  local_4a0._0_8_ = local_4a0._0_8_ & 0xffffffffffffff00;
  iVar15 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(&local_208,(key_type *)local_4b0);
  if ((_Rb_tree_header *)iVar15._M_node != p_Var1) {
    std::__cxx11::string::_M_assign
              ((string *)
               (local_650.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1));
    pVar31 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::equal_range(&local_208,(key_type *)local_4b0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_aux(&local_208,(_Base_ptr)pVar31.first._M_node,(_Base_ptr)pVar31.second._M_node);
  }
  if ((cmGeneratedFileStream *)local_4b0._0_8_ != (cmGeneratedFileStream *)local_4a0) {
    operator_delete((void *)local_4b0._0_8_,local_4a0._0_8_ + 1);
  }
  if ((_Rb_tree_header *)local_208._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    lVar30 = uVar27 << 5;
    p_Var16 = local_208._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      std::__cxx11::string::_M_assign
                ((string *)
                 ((long)&((local_650.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar30));
      p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
      lVar30 = lVar30 + 0x20;
    } while ((_Rb_tree_header *)p_Var16 != p_Var1);
  }
  pbVar26 = local_650.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_650.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_650.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var16 = (_Base_ptr)
              local_650.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pmVar17 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                              *)&local_1c0,(key_type *)p_Var16);
      ppcVar5 = (pmVar17->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pmVar17 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                              *)&local_1c0,(key_type *)p_Var16);
      ppcVar25 = (pmVar17->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      if (ppcVar5 != ppcVar25) {
        uVar27 = (long)ppcVar25 - (long)ppcVar5 >> 3;
        lVar30 = 0x3f;
        if (uVar27 != 0) {
          for (; uVar27 >> lVar30 == 0; lVar30 = lVar30 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                  (ppcVar5,ppcVar25,((uint)lVar30 ^ 0x3f) * 2 ^ 0x7e);
        if ((long)ppcVar25 - (long)ppcVar5 < 0x81) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                    (ppcVar5,ppcVar25);
        }
        else {
          ppcVar28 = ppcVar5 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                    (ppcVar5,ppcVar28);
          for (; ppcVar28 != ppcVar25; ppcVar28 = ppcVar28 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,__gnu_cxx::__ops::_Val_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                      (ppcVar28);
          }
        }
      }
      p_Var16 = p_Var16 + 1;
    } while (p_Var16 != (_Base_ptr)pbVar26);
    local_618._M_allocated_capacity = 0;
    local_618._8_8_ = (cmGeneratedFileStream **)0x0;
    local_608 = (cmGeneratedFileStream **)0x0;
    local_518 = (_Base_ptr)
                local_650.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    p_Var16 = (_Base_ptr)
              local_650.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_650.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_650.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        pcVar6 = this->GeneratorTarget;
        local_4b0._0_8_ = local_4a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_4b0,"GHS_NO_SOURCE_GROUP_FILE","");
        cVar18 = cmGeneratorTarget::GetProperty(pcVar6,(string *)local_4b0);
        fout = local_510;
        if (cVar18.Value == (string *)0x0) {
LAB_003b86c0:
          pcVar3 = this->Makefile;
          local_190._0_8_ = local_190 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_190,"CMAKE_GHS_NO_SOURCE_GROUP_FILE","");
          bVar11 = cmMakefile::IsOn(pcVar3,(string *)local_190);
          if ((cmSourceFile *)local_190._0_8_ != (cmSourceFile *)(local_190 + 0x10)) {
            operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
          }
        }
        else {
          value._M_str = extraout_RDX;
          value._M_len = (size_t)((cVar18.Value)->_M_dataplus)._M_p;
          bVar10 = cmValue::IsOn((cmValue *)(cVar18.Value)->_M_string_length,value);
          bVar11 = true;
          if (!bVar10) goto LAB_003b86c0;
        }
        if ((cmGeneratedFileStream *)local_4b0._0_8_ != (cmGeneratedFileStream *)local_4a0) {
          operator_delete((void *)local_4b0._0_8_,local_4a0._0_8_ + 1);
        }
        p_Var32 = p_Var16->_M_parent;
        if (bVar11 == false) {
          if (p_Var32 != (_Base_ptr)0x0) {
            local_6a8._0_8_ = local_6a8 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_6a8,*(long *)p_Var16,
                       (long)&p_Var32->_M_color + *(long *)p_Var16);
            cmsys::SystemTools::ReplaceString((string *)local_6a8,"\\","_");
            pcVar8 = cmGlobalGhsMultiGenerator::FILE_EXTENSION;
            local_4b0._0_8_ = local_6a8._8_8_;
            local_4b0._8_8_ = local_6a8._0_8_;
            local_4a0._0_8_ = 0;
            local_4a0._8_8_ = strlen(cmGlobalGhsMultiGenerator::FILE_EXTENSION);
            local_490 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)pcVar8;
            local_488._0_8_ = 0;
            views._M_len = 2;
            views._M_array = (iterator)local_4b0;
            cmCatViews((string *)&local_550,views);
            pcVar29 = this;
            psVar14 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                                (&this->LocalGenerator->super_cmLocalGenerator);
            (*(this->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter.
              _vptr_cmOutputConverter[0x10])(&local_670,this->LocalGenerator,this->GeneratorTarget);
            local_4b0._8_8_ = (psVar14->_M_dataplus)._M_p;
            local_4b0._0_8_ = psVar14->_M_string_length;
            local_4a0._0_8_ = (_func_int **)0x0;
            local_190._0_8_ = (cmSourceFile *)0x0;
            local_190._8_8_ = (char *)0x1;
            local_490 = local_178;
            local_178[0]._M_local_buf[0] = '/';
            local_4a0._8_8_ = 1;
            local_488._0_8_ = 0;
            local_488._8_8_ = local_670._8_8_;
            local_478 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_670._M_allocated_capacity;
            in_stack_fffffffffffff920._M_p = (pointer)0x0;
            local_6d8 = 1;
            local_6d0._0_8_ = local_6d0 + 8;
            local_6d0[8] = '/';
            local_468 = 1;
            local_460._8_8_ = 0;
            local_450 = (_Base_ptr)local_550.View_._M_len;
            local_448 = (cmAlphaNum *)local_550.RValueString_;
            local_440 = (_Base_ptr)0x0;
            views_00._M_len = 5;
            views_00._M_array = (iterator)local_4b0;
            local_470 = &local_670;
            local_460._M_allocated_capacity = local_6d0._0_8_;
            local_190._16_8_ = local_490;
            cmCatViews(&local_4e8,views_00);
            this = pcVar29;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_670._M_allocated_capacity != &local_660) {
              operator_delete((void *)local_670._M_allocated_capacity,
                              local_660._M_allocated_capacity + 1);
              this = pcVar29;
            }
            pcVar20 = (cmGeneratedFileStream *)operator_new(0x268);
            cmGeneratedFileStream::cmGeneratedFileStream(pcVar20,&local_4e8,false,None);
            local_4b0._0_8_ = pcVar20;
            cmGeneratedFileStream::SetCopyIfDifferent(pcVar20,true);
            if ((cmGeneratedFileStream **)local_618._8_8_ == local_608) {
              std::vector<cmGeneratedFileStream*,std::allocator<cmGeneratedFileStream*>>::
              _M_realloc_insert<cmGeneratedFileStream*const&>
                        ((vector<cmGeneratedFileStream*,std::allocator<cmGeneratedFileStream*>> *)
                         local_618._M_local_buf,(iterator)local_618._8_8_,
                         (cmGeneratedFileStream **)local_4b0);
            }
            else {
              *(undefined8 *)local_618._8_8_ = local_4b0._0_8_;
              local_618._8_8_ = local_618._8_8_ + 8;
            }
            uVar7 = local_4b0._0_8_;
            cmGlobalGhsMultiGenerator::WriteFileHeader
                      ((cmGlobalGhsMultiGenerator *)
                       (this->LocalGenerator->super_cmLocalGenerator).GlobalGenerator,
                       (ostream *)local_4b0._0_8_);
            GhsMultiGpj::WriteGpjTag(SUBPROJECT,(ostream *)local_4b0._0_8_);
            poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)fout,(char *)local_550.RValueString_,
                                 local_550.View_._M_len);
            std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
            GhsMultiGpj::WriteGpjTag(SUBPROJECT,(ostream *)fout);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
              operator_delete(local_4e8._M_dataplus._M_p,
                              (ulong)(local_4e8.field_2._M_allocated_capacity + 1));
            }
            if (local_550.RValueString_ != (string *)&local_550.View_._M_str) {
              operator_delete(local_550.RValueString_,(ulong)(local_550.View_._M_str + 1));
            }
            if ((undefined1 *)local_6a8._0_8_ != local_6a8 + 0x10) {
              operator_delete((void *)local_6a8._0_8_,local_6a8._16_8_ + 1);
            }
            fout = (cmGeneratedFileStream *)uVar7;
            if (p_Var16->_M_parent != (_Base_ptr)0x0) goto LAB_003b8b20;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)fout,"{comment} Others\n",0x11);
        }
        else if (p_Var32 == (_Base_ptr)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)fout,"{comment} Others",0x10);
          local_4b0[0] = 10;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,(char *)local_4b0,1);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"{comment} ",10);
          poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)fout,*(char **)p_Var16,(long)p_Var16->_M_parent);
          local_4b0[0] = 10;
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)local_4b0,1);
        }
LAB_003b8b20:
        p_Var32 = p_Var16;
        iVar13 = std::__cxx11::string::compare((char *)p_Var16);
        if (iVar13 == 0) {
          local_638.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_638.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_638.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bVar10 = ComputeCustomCommandOrder(this,&local_638);
          if (bVar10) {
            psVar14 = cmGeneratorTarget::GetName_abi_cxx11_(this->GeneratorTarget);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_190,"The custom commands for target [",psVar14);
            plVar22 = (long *)std::__cxx11::string::append((char *)local_190);
            local_4b0._0_8_ = local_4a0;
            pcVar20 = (cmGeneratedFileStream *)(plVar22 + 2);
            if ((cmGeneratedFileStream *)*plVar22 == pcVar20) {
              local_4a0._0_8_ =
                   (pcVar20->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                   _vptr_basic_ostream;
              local_4a0._8_8_ = plVar22[3];
            }
            else {
              local_4a0._0_8_ =
                   (pcVar20->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                   _vptr_basic_ostream;
              local_4b0._0_8_ = (cmGeneratedFileStream *)*plVar22;
            }
            local_4b0._8_8_ = plVar22[1];
            *plVar22 = (long)pcVar20;
            plVar22[1] = 0;
            *(undefined1 *)(plVar22 + 2) = 0;
            if ((cmSourceFile *)local_190._0_8_ != (cmSourceFile *)(local_190 + 0x10)) {
              operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
            }
            cmSystemTools::Error((string *)local_4b0);
            if ((cmGeneratedFileStream *)local_4b0._0_8_ != (cmGeneratedFileStream *)local_4a0) {
              operator_delete((void *)local_4b0._0_8_,local_4a0._0_8_ + 1);
            }
          }
          else {
            p_Var16 = (_Base_ptr)
                      local_638.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (local_638.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                local_638.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              do {
                pcVar23 = cmSourceFile::GetLocation(*(cmSourceFile **)p_Var16);
                local_4b0._0_8_ = local_4a0;
                pcVar4 = (this->Name)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_4b0,pcVar4,pcVar4 + (this->Name)._M_string_length);
                std::__cxx11::string::append((char *)local_4b0);
                uVar7 = local_4b0._0_8_;
                pcVar6 = (cmGeneratorTarget *)(pcVar23->Name)._M_string_length;
                if (pcVar6 == (cmGeneratorTarget *)local_4b0._8_8_) {
                  if (pcVar6 == (cmGeneratorTarget *)0x0) {
                    bVar10 = true;
                  }
                  else {
                    iVar13 = bcmp((pcVar23->Name)._M_dataplus._M_p,(void *)local_4b0._0_8_,
                                  (size_t)pcVar6);
                    bVar10 = iVar13 == 0;
                  }
                }
                else {
                  bVar10 = false;
                }
                if ((cmGeneratedFileStream *)uVar7 != (cmGeneratedFileStream *)local_4a0) {
                  operator_delete((void *)uVar7,local_4a0._0_8_ + 1);
                }
                if (bVar10) {
                  std::_V2::
                  __rotate<__gnu_cxx::__normal_iterator<cmSourceFile_const**,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>>
                            (p_Var16,&p_Var16->_M_parent);
                  break;
                }
                p_Var16 = (_Base_ptr)&p_Var16->_M_parent;
              } while (p_Var16 !=
                       (_Base_ptr)
                       local_638.
                       super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            }
            local_670._M_allocated_capacity = (size_type)&local_660;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_670,".sh","");
            local_5f8 = (_Base_ptr)
                        local_638.
                        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            if (local_638.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                local_638.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              iVar13 = 0;
              p_Var16 = (_Base_ptr)
                        local_638.
                        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              do {
                pcVar21 = cmSourceFile::GetCustomCommand(*(cmSourceFile **)p_Var16);
                local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
                pcVar4 = (this->ConfigName)._M_dataplus._M_p;
                pcVar29 = this;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_570,pcVar4,pcVar4 + (this->ConfigName)._M_string_length)
                ;
                local_5b0 = false;
                local_248 = 0;
                uStack_240 = 0;
                local_238 = (code *)0x0;
                uStack_230 = 0;
                computeInternalDepfile.super__Function_base._M_functor._8_8_ = pcVar29;
                computeInternalDepfile.super__Function_base._M_functor._M_unused._M_object =
                     &local_248;
                computeInternalDepfile.super__Function_base._M_manager = (_Manager_type)p_Var32;
                computeInternalDepfile._M_invoker = (_Invoker_type)in_stack_fffffffffffff920._M_p;
                cmCustomCommandGenerator::cmCustomCommandGenerator
                          ((cmCustomCommandGenerator *)local_190,pcVar21,&local_570,
                           &this->LocalGenerator->super_cmLocalGenerator,true,
                           (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_5d0,computeInternalDepfile);
                if (local_238 != (code *)0x0) {
                  (*local_238)(&local_248,&local_248,3);
                }
                if ((local_5b0 == true) &&
                   (local_5b0 = false,
                   local_5d0._M_value._M_dataplus._M_p !=
                   (_Alloc_hider)((long)&local_5d0._M_value + 0x10))) {
                  operator_delete((void *)local_5d0._M_value._M_dataplus._M_p,local_5d0._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_570._M_dataplus._M_p != &local_570.field_2) {
                  operator_delete(local_570._M_dataplus._M_p,
                                  local_570.field_2._M_allocated_capacity + 1);
                }
                this = pcVar29;
                psVar14 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                                    (&pcVar29->LocalGenerator->super_cmLocalGenerator);
                (*(pcVar29->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter.
                  _vptr_cmOutputConverter[0x10])
                          (&local_5f0,pcVar29->LocalGenerator,pcVar29->GeneratorTarget);
                pcVar23 = cmSourceFile::GetLocation(*(cmSourceFile **)p_Var16);
                local_4b0._8_8_ = (psVar14->_M_dataplus)._M_p;
                local_4b0._0_8_ = psVar14->_M_string_length;
                local_4a0._0_8_ = (_func_int **)0x0;
                in_stack_fffffffffffff920._M_p = (pointer)0x0;
                local_6d8 = 1;
                local_6d0._0_8_ = local_6d0 + 8;
                local_6d0[8] = '/';
                local_4a0._8_8_ = 1;
                local_488._0_8_ = 0;
                local_488._8_8_ = local_5f0._8_8_;
                local_478 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_5f0._M_allocated_capacity;
                local_470 = &local_5f0;
                local_6a8._0_8_ = (pointer)0x0;
                local_6a8._8_8_ = (cmGeneratorTarget *)0x1;
                local_6a8._16_8_ = local_690;
                local_690[0]._M_local_buf[0] = '/';
                local_468 = 1;
                local_460._8_8_ = 0;
                local_448 = (cmAlphaNum *)(this->Name)._M_dataplus._M_p;
                local_450 = (_Base_ptr)(this->Name)._M_string_length;
                local_440 = (_Base_ptr)0x0;
                local_438 = 3;
                local_430._M_p = "_cc";
                local_428 = 0;
                local_490 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_6d0._0_8_;
                local_460._M_allocated_capacity = local_6a8._16_8_;
                cmAlphaNum::cmAlphaNum(&local_550,iVar13);
                pcVar24 = (cmAlphaNum *)local_550.RValueString_;
                if ((cmAlphaNum *)local_550.RValueString_ == (cmAlphaNum *)0x0) {
                  pcVar24 = (cmAlphaNum *)&local_550.View_._M_str;
                }
                local_420._8_8_ = pcVar24->RValueString_;
                pcVar24 = (cmAlphaNum *)local_550.RValueString_;
                if ((cmAlphaNum *)local_550.RValueString_ == (cmAlphaNum *)0x0) {
                  pcVar24 = &local_550;
                }
                local_420._M_allocated_capacity = (pcVar24->View_)._M_len;
                local_410 = (cmAlphaNum *)local_550.RValueString_;
                local_4e8._M_dataplus._M_p = (pointer)0x0;
                local_4e8._M_string_length = 1;
                local_4e8.field_2._M_allocated_capacity = (long)&local_4e8.field_2 + 8;
                local_4e8.field_2._M_local_buf[8] = '_';
                local_408._M_p = (pointer)0x1;
                local_400._8_8_ = 0;
                local_400._24_8_ = (pcVar23->Name)._M_dataplus._M_p;
                local_400._16_8_ = (pcVar23->Name)._M_string_length;
                local_3e0 = 0;
                local_3d8._M_allocated_capacity = local_670._8_8_;
                local_3d8._8_8_ = local_670._M_allocated_capacity;
                local_3c8 = 0;
                views_01._M_len = 10;
                views_01._M_array = (iterator)local_4b0;
                local_400._0_8_ = local_4e8.field_2._M_allocated_capacity;
                cmCatViews(&local_590,views_01);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5f0._M_allocated_capacity != &local_5e0) {
                  operator_delete((void *)local_5f0._M_allocated_capacity,
                                  (ulong)(local_5e0._M_allocated_capacity + 1));
                }
                cmGeneratedFileStream::cmGeneratedFileStream
                          ((cmGeneratedFileStream *)local_4b0,&local_590,false,None);
                cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_4b0,true);
                WriteCustomCommandsHelper
                          (this,(ostream *)local_4b0,(cmCustomCommandGenerator *)local_190);
                pcVar29 = (cmGhsMultiTargetGenerator *)local_4b0;
                cmGeneratedFileStream::Close((cmGeneratedFileStream *)local_4b0);
                WriteCustomCommandLine
                          (pcVar29,(ostream *)fout,&local_590,(cmCustomCommandGenerator *)local_190)
                ;
                cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_4b0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_590._M_dataplus._M_p != &local_590.field_2) {
                  operator_delete(local_590._M_dataplus._M_p,
                                  local_590.field_2._M_allocated_capacity + 1);
                }
                cmCustomCommandGenerator::~cmCustomCommandGenerator
                          ((cmCustomCommandGenerator *)local_190);
                p_Var16 = (_Base_ptr)&p_Var16->_M_parent;
                iVar13 = iVar13 + 1;
              } while (p_Var16 != local_5f8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_670._M_allocated_capacity != &local_660) {
              operator_delete((void *)local_670._M_allocated_capacity,
                              local_660._M_allocated_capacity + 1);
            }
          }
          if (this->TagType == CUSTOM_TARGET) {
            WriteBuildEvents(this,(ostream *)fout);
          }
          if ((_Base_ptr)
              local_638.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
            operator_delete(local_638.
                            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_638.
                                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_638.
                                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
          pmVar17 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                                  *)&local_1c0,(key_type *)p_Var16);
          p_Var16 = (_Base_ptr)
                    (pmVar17->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          local_5f8 = (_Base_ptr)
                      (pmVar17->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)
                      ._M_impl.super__Vector_impl_data._M_finish;
          if (p_Var16 != local_5f8) {
            do {
              this_00 = *(cmSourceFile **)p_Var16;
              psVar14 = cmSourceFile::GetFullPath_abi_cxx11_(this_00);
              local_4b0._0_8_ = local_4a0;
              pcVar4 = (psVar14->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_4b0,pcVar4,pcVar4 + psVar14->_M_string_length);
              cmSystemTools::ConvertToOutputSlashes((string *)local_4b0);
              local_190._0_8_ = local_190 + 0x10;
              local_190._8_8_ = (char *)0x0;
              local_190._16_8_ = local_190._16_8_ & 0xffffffffffffff00;
              TVar2 = this->TagType;
              if (TVar2 == CUSTOM_TARGET) {
                cmSourceFile::GetLanguage_abi_cxx11_(&local_508,this_00);
                bVar10 = true;
                if (local_508._M_string_length == 0) goto LAB_003b8bf5;
LAB_003b8c09:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_508._M_dataplus._M_p != &local_508.field_2) {
                  operator_delete(local_508._M_dataplus._M_p,
                                  local_508.field_2._M_allocated_capacity + 1);
                }
                if (bVar10) goto LAB_003b8c3c;
LAB_003b8c32:
                bVar10 = false;
              }
              else {
LAB_003b8bf5:
                pcVar21 = cmSourceFile::GetCustomCommand(this_00);
                bVar10 = pcVar21 != (cmCustomCommand *)0x0;
                if (TVar2 == CUSTOM_TARGET) goto LAB_003b8c09;
                if (pcVar21 == (cmCustomCommand *)0x0) goto LAB_003b8c32;
LAB_003b8c3c:
                bVar10 = true;
                std::__cxx11::string::_M_replace
                          ((ulong)local_190,0,(char *)local_190._8_8_,0x800551);
              }
              poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)fout,(char *)local_190._0_8_,local_190._8_8_);
              poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar19,(char *)local_4b0._0_8_,local_4b0._8_8_);
              WriteObjectLangOverride_abi_cxx11_
                        ((string *)&stack0xfffffffffffff920,(cmGhsMultiTargetGenerator *)this_00,
                         sourceFile);
              poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar19,in_stack_fffffffffffff920._M_p,local_6d8);
              local_6a8[0] = 10;
              std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_6a8,1);
              if (in_stack_fffffffffffff920._M_p != local_6d0) {
                operator_delete(in_stack_fffffffffffff920._M_p,local_6d0._0_8_ + 1);
              }
              pcVar4 = local_6a8 + 0x10;
              if (!bVar10) {
                _Var33._M_p = local_6d0;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&stack0xfffffffffffff920,"INCLUDE_DIRECTORIES","");
                pcVar29 = (cmGhsMultiTargetGenerator *)local_6a8;
                local_6a8._0_8_ = pcVar4;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"-I","");
                WriteSourceProperty(pcVar29,(ostream *)fout,this_00,
                                    (string *)&stack0xfffffffffffff920,(string *)local_6a8);
                if ((pointer)local_6a8._0_8_ != pcVar4) {
                  operator_delete((void *)local_6a8._0_8_,local_6a8._16_8_ + 1);
                }
                if (_Var33._M_p != local_6d0) {
                  operator_delete(_Var33._M_p,local_6d0._0_8_ + 1);
                }
                _Var33._M_p = local_6d0;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&stack0xfffffffffffff920,"COMPILE_DEFINITIONS","");
                pcVar29 = (cmGhsMultiTargetGenerator *)local_6a8;
                local_6a8._0_8_ = pcVar4;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"-D","");
                WriteSourceProperty(pcVar29,(ostream *)fout,this_00,
                                    (string *)&stack0xfffffffffffff920,(string *)local_6a8);
                if ((pointer)local_6a8._0_8_ != pcVar4) {
                  operator_delete((void *)local_6a8._0_8_,local_6a8._16_8_ + 1);
                }
                if (_Var33._M_p != local_6d0) {
                  operator_delete(_Var33._M_p,local_6d0._0_8_ + 1);
                }
                _Var33._M_p = local_6d0;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&stack0xfffffffffffff920,"COMPILE_OPTIONS","");
                pcVar29 = (cmGhsMultiTargetGenerator *)local_6a8;
                local_6a8._0_8_ = pcVar4;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"");
                WriteSourceProperty(pcVar29,(ostream *)fout,this_00,
                                    (string *)&stack0xfffffffffffff920,(string *)local_6a8);
                if ((pointer)local_6a8._0_8_ != pcVar4) {
                  operator_delete((void *)local_6a8._0_8_,local_6a8._16_8_ + 1);
                }
                if (_Var33._M_p != local_6d0) {
                  operator_delete(_Var33._M_p,local_6d0._0_8_ + 1);
                }
                psVar14 = cmGeneratorTarget::GetObjectName_abi_cxx11_(this->GeneratorTarget,this_00)
                ;
                in_stack_fffffffffffff920._M_p = local_6d0;
                pcVar4 = (psVar14->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&stack0xfffffffffffff920,pcVar4,
                           pcVar4 + psVar14->_M_string_length);
                if ((local_6d8 != 0) &&
                   (bVar10 = cmGeneratorTarget::HasExplicitObjectName(this->GeneratorTarget,this_00)
                   , bVar10)) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"    -o ",7);
                  poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)fout,in_stack_fffffffffffff920._M_p,local_6d8);
                  local_6a8[0] = 10;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_6a8,1);
                }
                if (in_stack_fffffffffffff920._M_p != local_6d0) {
                  operator_delete(in_stack_fffffffffffff920._M_p,local_6d0._0_8_ + 1);
                }
              }
              if ((cmSourceFile *)local_190._0_8_ != (cmSourceFile *)(local_190 + 0x10)) {
                operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
              }
              if ((cmGeneratedFileStream *)local_4b0._0_8_ != (cmGeneratedFileStream *)local_4a0) {
                operator_delete((void *)local_4b0._0_8_,local_4a0._0_8_ + 1);
              }
              p_Var16 = (_Base_ptr)&p_Var16->_M_parent;
            } while (p_Var16 != local_5f8);
          }
        }
        uVar9 = local_618._8_8_;
        p_Var16 = p_Var32 + 1;
        uVar7 = local_618._M_allocated_capacity;
      } while (p_Var32 + 1 != local_518);
      for (; uVar7 != uVar9; uVar7 = (cmGeneratedFileStream **)(uVar7 + 8)) {
        cmGeneratedFileStream::Close(*(cmGeneratedFileStream **)uVar7);
      }
      if ((cmGeneratedFileStream **)local_618._M_allocated_capacity != (cmGeneratedFileStream **)0x0
         ) {
        operator_delete((void *)local_618._M_allocated_capacity,
                        (long)local_608 - local_618._M_allocated_capacity);
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_650);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_220);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_208);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
  ::~_Rb_tree(&local_1c0);
  std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector(&local_1d8);
  if (local_5a8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5a8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_5a8.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5a8.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteSources(std::ostream& fout_proj)
{
  /* vector of all sources for this target */
  std::vector<cmSourceFile*> sources;
  this->GeneratorTarget->GetSourceFiles(sources, this->ConfigName);

  /* vector of all groups defined for this target
   * -- but the vector is not expanded with sub groups or in any useful order
   */
  std::vector<cmSourceGroup> sourceGroups = this->Makefile->GetSourceGroups();

  /* for each source file assign it to its group */
  std::map<std::string, std::vector<cmSourceFile*>> groupFiles;
  std::set<std::string> groupNames;
  for (cmSourceFile* sf : sources) {
    cmSourceGroup* sourceGroup =
      this->Makefile->FindSourceGroup(sf->ResolveFullPath(), sourceGroups);
    std::string gn = sourceGroup->GetFullName();
    groupFiles[gn].push_back(sf);
    groupNames.insert(std::move(gn));
  }

  /* list of known groups and the order they are displayed in a project file */
  const std::vector<std::string> standardGroups = {
    "CMake Rules",  "Header Files",     "Source Files",
    "Object Files", "Object Libraries", "Resources"
  };

  /* list of groups in the order they are displayed in a project file*/
  std::vector<std::string> groupFilesList(groupFiles.size());

  /* put the groups in the order they should be listed
   * - standard groups first, and then everything else
   *   in the order used by std::map.
   */
  int i = 0;
  for (const std::string& gn : standardGroups) {
    auto n = groupNames.find(gn);
    if (n != groupNames.end()) {
      groupFilesList[i] = *n;
      i += 1;
      groupNames.erase(gn);
    } else if (this->TagType == GhsMultiGpj::CUSTOM_TARGET &&
               gn == "CMake Rules") {
      /* make sure that rules folder always exists in case of custom targets
       * that have no custom commands except for pre or post build events.
       */
      groupFilesList.resize(groupFilesList.size() + 1);
      groupFilesList[i] = gn;
      i += 1;
    }
  }

  { /* catch-all group - is last item */
    std::string gn;
    auto n = groupNames.find(gn);
    if (n != groupNames.end()) {
      groupFilesList.back() = *n;
      groupNames.erase(gn);
    }
  }

  for (const auto& n : groupNames) {
    groupFilesList[i] = n;
    i += 1;
  }

  /* sort the files within each group */
  for (auto& n : groupFilesList) {
    std::sort(groupFiles[n].begin(), groupFiles[n].end(),
              [](cmSourceFile* l, cmSourceFile* r) {
                return l->ResolveFullPath() < r->ResolveFullPath();
              });
  }

  /* list of open project files */
  std::vector<cmGeneratedFileStream*> gfiles;

  /* write files into the proper project file
   * -- groups go into main project file
   *    unless NO_SOURCE_GROUP_FILE property or variable is set.
   */
  for (auto& sg : groupFilesList) {
    std::ostream* fout;
    bool useProjectFile =
      this->GeneratorTarget->GetProperty("GHS_NO_SOURCE_GROUP_FILE").IsOn() ||
      this->Makefile->IsOn("CMAKE_GHS_NO_SOURCE_GROUP_FILE");
    if (useProjectFile || sg.empty()) {
      fout = &fout_proj;
    } else {
      // Open the filestream in copy-if-different mode.
      std::string gname = sg;
      cmsys::SystemTools::ReplaceString(gname, "\\", "_");
      std::string lpath =
        cmStrCat(gname, cmGlobalGhsMultiGenerator::FILE_EXTENSION);
      std::string fpath = cmStrCat(
        this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
        this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget), '/',
        lpath);
      cmGeneratedFileStream* f = new cmGeneratedFileStream(fpath);
      f->SetCopyIfDifferent(true);
      gfiles.push_back(f);
      fout = f;
      this->GetGlobalGenerator()->WriteFileHeader(*f);
      GhsMultiGpj::WriteGpjTag(GhsMultiGpj::SUBPROJECT, *f);
      fout_proj << lpath << " ";
      GhsMultiGpj::WriteGpjTag(GhsMultiGpj::SUBPROJECT, fout_proj);
    }

    if (useProjectFile) {
      if (sg.empty()) {
        *fout << "{comment} Others" << '\n';
      } else {
        *fout << "{comment} " << sg << '\n';
      }
    } else if (sg.empty()) {
      *fout << "{comment} Others\n";
    }

    if (sg != "CMake Rules") {
      /* output rule for each source file */
      for (const cmSourceFile* si : groupFiles[sg]) {
        bool compile = true;
        // Convert filename to native system
        // WORKAROUND: GHS MULTI 6.1.4 and 6.1.6 are known to need backslash on
        // windows when opening some files from the search window.
        std::string fname(si->GetFullPath());
        cmSystemTools::ConvertToOutputSlashes(fname);

        /* For custom targets list any associated sources,
         * comment out source code to prevent it from being
         * compiled when processing this target.
         * Otherwise, comment out any custom command (main) dependencies that
         * are listed as source files to prevent them from being considered
         * part of the build.
         */
        std::string comment;
        if ((this->TagType == GhsMultiGpj::CUSTOM_TARGET &&
             !si->GetLanguage().empty()) ||
            si->GetCustomCommand()) {
          comment = "{comment} ";
          compile = false;
        }

        *fout << comment << fname << WriteObjectLangOverride(si) << '\n';
        if (compile) {
          this->WriteSourceProperty(*fout, si, "INCLUDE_DIRECTORIES", "-I");
          this->WriteSourceProperty(*fout, si, "COMPILE_DEFINITIONS", "-D");
          this->WriteSourceProperty(*fout, si, "COMPILE_OPTIONS", "");

          /* to avoid clutter in the GUI only print out the objectName if it
           * has been renamed */
          std::string objectName = this->GeneratorTarget->GetObjectName(si);
          if (!objectName.empty() &&
              this->GeneratorTarget->HasExplicitObjectName(si)) {
            *fout << "    -o " << objectName << '\n';
          }
        }
      }
    } else {
      std::vector<cmSourceFile const*> customCommands;
      if (this->ComputeCustomCommandOrder(customCommands)) {
        std::string message = "The custom commands for target [" +
          this->GeneratorTarget->GetName() + "] had a cycle.\n";
        cmSystemTools::Error(message);
      } else {
        /* Custom targets do not have a dependency on SOURCES files.
         * Therefore the dependency list may include SOURCES files after the
         * custom target. Because nothing can depend on the custom target just
         * move it to the last item.
         */
        for (auto sf = customCommands.begin(); sf != customCommands.end();
             ++sf) {
          if (((*sf)->GetLocation()).GetName() == this->Name + ".rule") {
            std::rotate(sf, sf + 1, customCommands.end());
            break;
          }
        }
        int cmdcount = 0;
#ifdef _WIN32
        std::string fext = ".bat";
#else
        std::string fext = ".sh";
#endif
        for (auto& sf : customCommands) {
          const cmCustomCommand* cc = sf->GetCustomCommand();
          cmCustomCommandGenerator ccg(*cc, this->ConfigName,
                                       this->LocalGenerator);

          // Open the filestream for this custom command
          std::string fname = cmStrCat(
            this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
            this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
            '/', this->Name, "_cc", cmdcount++, '_',
            (sf->GetLocation()).GetName(), fext);

          cmGeneratedFileStream f(fname);
          f.SetCopyIfDifferent(true);
          this->WriteCustomCommandsHelper(f, ccg);
          f.Close();
          this->WriteCustomCommandLine(*fout, fname, ccg);
        }
      }
      if (this->TagType == GhsMultiGpj::CUSTOM_TARGET) {
        this->WriteBuildEvents(*fout);
      }
    }
  }

  for (cmGeneratedFileStream* f : gfiles) {
    f->Close();
  }
}